

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O3

Reals __thiscall
Omega_h::measure_ents_real_tmpl<2,2>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *coords)

{
  Alloc *pAVar1;
  int *piVar2;
  ulong *puVar3;
  LOs *pLVar4;
  undefined8 uVar5;
  undefined8 this_00;
  long *plVar6;
  int iVar7;
  ulong *puVar8;
  void *extraout_RDX;
  void *pvVar9;
  LO size_in;
  size_t sVar10;
  Alloc *this_01;
  Alloc *pAVar11;
  bool bVar12;
  Reals RVar13;
  ScopedTimer omega_h_scoped_function_timer;
  Write<double> sizes;
  RealSimplexSizes measurer;
  type f;
  LOs ev2v;
  ScopedTimer local_f9;
  Write<double> local_f8;
  undefined1 local_e8 [56];
  undefined1 local_b0 [32];
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  void *local_78;
  LOs *local_70;
  Write<double> local_68;
  undefined1 local_58 [40];
  
  local_70 = a2e;
  local_58._0_8_ = (Alloc *)(local_58 + 0x10);
  local_58._32_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append(local_58);
  puVar3 = (ulong *)(local_e8 + 0x28);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_e8._40_8_ = *puVar8;
    local_e8._48_8_ = plVar6[3];
    local_e8._24_8_ = puVar3;
  }
  else {
    local_e8._40_8_ = *puVar8;
    local_e8._24_8_ = (ulong *)*plVar6;
  }
  local_e8._32_8_ = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_f8.shared_alloc_.alloc = (Alloc *)local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x02');
  *(undefined2 *)&(local_f8.shared_alloc_.alloc)->size = 0x3335;
  pvVar9 = (void *)0xf;
  if ((ulong *)local_e8._24_8_ != puVar3) {
    pvVar9 = (void *)local_e8._40_8_;
  }
  if (pvVar9 < (void *)((long)local_f8.shared_alloc_.direct_ptr + local_e8._32_8_)) {
    pvVar9 = (void *)0xf;
    if (local_f8.shared_alloc_.alloc != (Alloc *)local_e8) {
      pvVar9 = (void *)local_e8._0_8_;
    }
    if ((void *)((long)local_f8.shared_alloc_.direct_ptr + local_e8._32_8_) <= pvVar9) {
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,local_e8._24_8_)
      ;
      goto LAB_003b9e5c;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append
                             (local_e8 + 0x18,(ulong)local_f8.shared_alloc_.alloc);
LAB_003b9e5c:
  local_b0._0_8_ = local_b0 + 0x10;
  pAVar1 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar1) {
    local_b0._16_8_ = pAVar1->size;
    local_b0._24_8_ = plVar6[3];
  }
  else {
    local_b0._16_8_ = pAVar1->size;
    local_b0._0_8_ = (Alloc *)*plVar6;
  }
  local_b0._8_8_ = plVar6[1];
  *plVar6 = (long)pAVar1;
  plVar6[1] = 0;
  *(undefined1 *)&pAVar1->size = 0;
  begin_code("measure_ents_real_tmpl",(char *)local_b0._0_8_);
  pAVar1 = (Alloc *)(local_b0 + 0x10);
  if ((Alloc *)local_b0._0_8_ != pAVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (local_f8.shared_alloc_.alloc != (Alloc *)local_e8) {
    operator_delete(local_f8.shared_alloc_.alloc,local_e8._0_8_ + 1);
  }
  if ((ulong *)local_e8._24_8_ != puVar3) {
    operator_delete((void *)local_e8._24_8_,local_e8._40_8_ + 1);
  }
  if ((Alloc *)local_58._0_8_ != (Alloc *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
  }
  pAVar11 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar11 = (Alloc *)(pAVar11->size * 8 + 1);
    }
    else {
      pAVar11->use_count = pAVar11->use_count + 1;
    }
  }
  local_e8._32_8_ = (coords->write_).shared_alloc_.direct_ptr;
  this_01 = pAVar11;
  local_e8._24_8_ = pAVar11;
  if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      iVar7 = pAVar11->use_count + -1;
      this_01 = (Alloc *)(pAVar11->size * 8 + 1);
    }
    else {
      iVar7 = pAVar11->use_count;
      pAVar11->use_count = iVar7 + 1;
    }
    pAVar11->use_count = iVar7;
    local_e8._24_8_ = this_01;
    if (iVar7 == 0) {
      Alloc::~Alloc(pAVar11);
      operator_delete(pAVar11,0x48);
    }
  }
  pLVar4 = local_70;
  Mesh::ask_verts_of((Mesh *)local_58,(Int)mesh);
  pAVar11 = (pLVar4->write_).shared_alloc_.alloc;
  if (((ulong)pAVar11 & 1) == 0) {
    sVar10 = pAVar11->size;
  }
  else {
    sVar10 = (ulong)pAVar11 >> 3;
  }
  local_b0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  size_in = (LO)(sVar10 >> 2);
  Write<double>::Write(&local_f8,size_in,(string *)local_b0);
  if ((Alloc *)local_b0._0_8_ != pAVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  local_b0._0_8_ = (pLVar4->write_).shared_alloc_.alloc;
  if ((local_b0._0_8_ & 7) == 0 && (Alloc *)local_b0._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0._0_8_ = ((Alloc *)local_b0._0_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_b0._0_8_)->use_count = ((Alloc *)local_b0._0_8_)->use_count + 1;
    }
  }
  local_b0._8_8_ = (pLVar4->write_).shared_alloc_.direct_ptr;
  local_b0._16_8_ = local_58._0_8_;
  if ((local_58._0_8_ & 7) == 0 && (Alloc *)local_58._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0._16_8_ = *(size_t *)local_58._0_8_ * 8 + 1;
    }
    else {
      *(int *)(local_58._0_8_ + 0x30) = *(int *)(local_58._0_8_ + 0x30) + 1;
    }
  }
  local_b0._24_8_ = local_58._8_8_;
  local_90 = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88 = local_f8.shared_alloc_.direct_ptr;
  bVar12 = ((ulong)this_01 & 7) == 0;
  local_80 = this_01;
  if (bVar12 && this_01 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(this_01->size * 8 + 1);
    }
    else {
      this_01->use_count = this_01->use_count + 1;
    }
  }
  local_78 = (void *)local_e8._32_8_;
  parallel_for<Omega_h::measure_ents_real_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (size_in,(type *)local_b0,"measure_ents_real");
  this_00 = local_58._32_8_;
  local_68.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
  local_68.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
  if ((((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
       local_f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + -1;
    local_68.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_f8.shared_alloc_.alloc = (Alloc *)0x0;
  local_f8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this_00,&local_68);
  pAVar1 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar1);
      operator_delete(pAVar1,0x48);
    }
  }
  measure_ents_real_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)local_b0);
  pAVar1 = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_f8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_f8.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  uVar5 = local_58._0_8_;
  if ((local_58._0_8_ & 7) == 0 && (Alloc *)local_58._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_58._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_58._0_8_);
      operator_delete((void *)uVar5,0x48);
    }
  }
  if (bVar12 && this_01 != (Alloc *)0x0) {
    piVar2 = &this_01->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_f9);
  RVar13.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar13.write_.shared_alloc_.alloc = (Alloc *)this_00;
  return (Reals)RVar13.write_.shared_alloc_;
}

Assistant:

Reals measure_ents_real_tmpl(Mesh* mesh, LOs a2e, Reals coords) {
  OMEGA_H_TIME_FUNCTION;
  RealSimplexSizes measurer(coords);
  auto ev2v = mesh->ask_verts_of(edim);
  auto na = a2e.size();
  Write<Real> sizes(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<edim + 1>(ev2v, e);
    sizes[a] = measurer.measure<sdim, edim>(v);
  };
  parallel_for(na, f, "measure_ents_real");
  return sizes;
}